

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void ch_addnative(ch_context *context,ch_native_function function,char *name)

{
  size_t sVar1;
  ch_string *name_00;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar2;
  ch_primitive value;
  ch_native *native;
  ch_string *s;
  char *name_local;
  ch_native_function function_local;
  ch_context *context_local;
  
  sVar1 = strlen(name);
  name_00 = (ch_string *)ch_loadstring(context,name,sVar1,1);
  aVar2.number_value = (double)ch_loadnative(function);
  value.field_1.number_value = (double)aVar2.object_value;
  value._0_8_ = 3;
  add_global(context,name_00,value);
  return;
}

Assistant:

void ch_addnative(ch_context *context, ch_native_function function,
                  const char *name) {
  ch_string *s = ch_loadstring(context, name, strlen(name), true);
  ch_native *native = ch_loadnative(function);

  add_global(context, s, MAKE_OBJECT(native));
}